

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

TypedVector * __thiscall
flexbuffers::Reference::AsTypedVector(TypedVector *__return_storage_ptr__,Reference *this)

{
  uint8_t byte_width;
  bool bVar1;
  Type element_type;
  uint8_t *data;
  TypedVector *tv;
  Reference *this_local;
  
  bVar1 = IsTypedVector(this);
  if (bVar1) {
    data = Indirect(this);
    byte_width = this->byte_width_;
    element_type = ToTypedVectorElementType(this->type_);
    TypedVector::TypedVector(__return_storage_ptr__,data,byte_width,element_type);
    if (__return_storage_ptr__->type_ == FBT_STRING) {
      __return_storage_ptr__->type_ = FBT_KEY;
    }
  }
  else {
    TypedVector::EmptyTypedVector();
  }
  return __return_storage_ptr__;
}

Assistant:

TypedVector AsTypedVector() const {
    if (IsTypedVector()) {
      auto tv =
          TypedVector(Indirect(), byte_width_, ToTypedVectorElementType(type_));
      if (tv.type_ == FBT_STRING) {
        // These can't be accessed as strings, since we don't know the bit-width
        // of the size field, see the declaration of
        // FBT_VECTOR_STRING_DEPRECATED above for details.
        // We change the type here to be keys, which are a subtype of strings,
        // and will ignore the size field. This will truncate strings with
        // embedded nulls.
        tv.type_ = FBT_KEY;
      }
      return tv;
    } else {
      return TypedVector::EmptyTypedVector();
    }
  }